

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.cc
# Opt level: O3

int BUF_MEM_append(BUF_MEM *buf,void *in,size_t len)

{
  int iVar1;
  int iVar2;
  size_t cap;
  
  iVar2 = 1;
  if (len != 0) {
    cap = buf->length + len;
    if (CARRY8(buf->length,len)) {
      iVar2 = 0;
      ERR_put_error(7,0,0x45,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/buf/buf.cc"
                    ,0x57);
    }
    else {
      iVar1 = BUF_MEM_reserve(buf,cap);
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      else {
        memcpy(buf->data + buf->length,in,len);
        buf->length = cap;
      }
    }
  }
  return iVar2;
}

Assistant:

int BUF_MEM_append(BUF_MEM *buf, const void *in, size_t len) {
  // Work around a C language bug. See https://crbug.com/1019588.
  if (len == 0) {
    return 1;
  }
  size_t new_len = buf->length + len;
  if (new_len < len) {
    OPENSSL_PUT_ERROR(BUF, ERR_R_OVERFLOW);
    return 0;
  }
  if (!BUF_MEM_reserve(buf, new_len)) {
    return 0;
  }
  OPENSSL_memcpy(buf->data + buf->length, in, len);
  buf->length = new_len;
  return 1;
}